

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O1

string * __thiscall
leveldb::log::RandomSkewedString_abi_cxx11_
          (string *__return_storage_ptr__,log *this,int i,Random *rnd)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  undefined4 in_register_00000014;
  uint uVar4;
  string local_38;
  
  NumberString_abi_cxx11_(&local_38,this,i);
  uVar2 = (ulong)*(uint *)CONCAT44(in_register_00000014,i) * 0x41a7;
  uVar3 = (int)(uVar2 >> 0x1f) + ((uint)uVar2 & 0x7fffffff);
  uVar1 = uVar3 + 0x80000001;
  if (-1 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar4 = (int)((ulong)uVar1 * 0x41a7 >> 0x1f) + ((uint)((ulong)uVar1 * 0x41a7) & 0x7fffffff);
  uVar3 = uVar4 + 0x80000001;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4;
  }
  *(uint *)CONCAT44(in_register_00000014,i) = uVar3;
  BigString(__return_storage_ptr__,&local_38,
            (ulong)(~(-1 << ((char)uVar1 + (char)(uVar1 / 0x12) * -0x12 & 0x1fU)) & uVar3));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string RandomSkewedString(int i, Random* rnd) {
  return BigString(NumberString(i), rnd->Skewed(17));
}